

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O2

void __thiscall Assimp::X3DExporter::Export_Node(X3DExporter *this,aiNode *pNode,size_t pTabLevel)

{
  aiMetadataType value;
  aiMetadataEntry *paVar1;
  aiVector3D pVector;
  aiVector3D pVector_00;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  aiMetadata *paVar5;
  size_t idx_mesh;
  ulong uVar6;
  long lVar7;
  aiString *pKey;
  size_t pTabLevel_00;
  long lVar8;
  allocator<char> local_205;
  ai_real rotate_angle;
  undefined1 local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  size_t local_1c0;
  aiVector3t<float> local_1b8;
  aiVector3t<float> local_1a8;
  ai_real local_19c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  anon_class_8_1_8991fb9c Vector2String;
  aiVector3t<float> local_170;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  float fStack_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&attr_list;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node._M_size = 0;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       attr_list.
       super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  bVar3 = CheckAndExport_Light(this,pNode,pTabLevel);
  if (!bVar3) {
    if ((pNode->mName).length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"DEF",(allocator<char> *)&local_198);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,(pNode->mName).data,(allocator<char> *)&local_130);
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
      push_back(&attr_list,(value_type *)local_200);
      SAttribute::~SAttribute((SAttribute *)local_200);
    }
    bVar3 = aiMatrix4x4t<float>::IsIdentity(&pNode->mTransformation);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"Group",(allocator<char> *)&local_198);
      NodeHelper_OpenNode(this,(string *)local_200,pTabLevel,false);
    }
    else {
      local_170.x = 0.0;
      local_170.y = 0.0;
      local_170.z = 0.0;
      local_1a8.x = 0.0;
      local_1a8.y = 0.0;
      local_1a8.z = 0.0;
      local_1b8.x = 0.0;
      local_1b8.y = 0.0;
      local_1b8.z = 0.0;
      Vector2String.this = this;
      aiMatrix4x4t<float>::Decompose
                (&pNode->mTransformation,&local_170,&local_1b8,&rotate_angle,&local_1a8);
      if (((rotate_angle != 0.0) || (NAN(rotate_angle))) &&
         (0.0 < SQRT(local_1b8.z * local_1b8.z +
                     local_1b8.x * local_1b8.x + local_1b8.y * local_1b8.y))) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_200,"rotation",&local_205);
        uVar2 = local_1b8._0_8_;
        local_1c0 = CONCAT44(local_1c0._4_4_,local_1b8.z);
        local_19c = rotate_angle;
        std::__cxx11::to_string(&local_b0,local_1b8.x);
        std::operator+(&local_90,&local_b0," ");
        fStack_144 = SUB84(uVar2,4);
        std::__cxx11::to_string(&local_d0,fStack_144);
        std::operator+(&local_70,&local_90,&local_d0);
        std::operator+(&local_50,&local_70," ");
        std::__cxx11::to_string(&local_f0,(float)local_1c0);
        std::operator+(&local_130,&local_50,&local_f0);
        std::operator+(&local_198,&local_130," ");
        std::__cxx11::to_string(&local_110,local_19c);
        std::operator+(&local_1e0,&local_198,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        AttrHelper_CommaToPoint(this,&local_1e0);
        std::__cxx11::
        list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
        push_back(&attr_list,(value_type *)local_200);
        SAttribute::~SAttribute((SAttribute *)local_200);
      }
      local_200._0_8_ = (pointer)0x3f8000003f800000;
      local_200._8_4_ = 1.0;
      bVar4 = aiVector3t<float>::Equal(&local_170,(aiVector3t<float> *)local_200,1e-06);
      if (!bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_200,"scale",(allocator<char> *)&local_198);
        pVector_00.z = local_170.z;
        pVector_00.x = local_170.x;
        pVector_00.y = local_170.y;
        Export_Node(aiNode_const*,unsigned_long)::$_1::operator()[abi_cxx11_
                  (&local_1e0,&Vector2String,pVector_00);
        std::__cxx11::
        list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
        push_back(&attr_list,(value_type *)local_200);
        SAttribute::~SAttribute((SAttribute *)local_200);
      }
      if (0.0 < SQRT(local_1a8.z * local_1a8.z +
                     local_1a8.x * local_1a8.x + local_1a8.y * local_1a8.y)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_200,"translation",(allocator<char> *)&local_198);
        pVector.y = local_1a8.y;
        pVector.x = local_1a8.x;
        pVector.z = local_1a8.z;
        Export_Node(aiNode_const*,unsigned_long)::$_1::operator()[abi_cxx11_
                  (&local_1e0,&Vector2String,pVector);
        std::__cxx11::
        list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
        push_back(&attr_list,(value_type *)local_200);
        SAttribute::~SAttribute((SAttribute *)local_200);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"Transform",(allocator<char> *)&local_198);
      NodeHelper_OpenNode(this,(string *)local_200,pTabLevel,false,&attr_list);
    }
    std::__cxx11::string::~string((string *)local_200);
    paVar5 = pNode->mMetaData;
    pTabLevel_00 = pTabLevel + 1;
    local_1c0 = pTabLevel;
    if (paVar5 != (aiMetadata *)0x0) {
      lVar7 = 8;
      lVar8 = 0;
      for (uVar6 = 0; uVar6 < paVar5->mNumProperties; uVar6 = uVar6 + 1) {
        paVar1 = paVar5->mValues;
        value = *(aiMetadataType *)((long)paVar1 + lVar7 + -8);
        if (value < AI_AIVECTOR3D) {
          pKey = (aiString *)(paVar5->mKeys->data + lVar8 + -4);
          switch(value) {
          case AI_BOOL:
            Export_MetadataBoolean
                      (this,pKey,*(bool *)*(undefined8 *)((long)&paVar1->mType + lVar7),pTabLevel_00
                      );
            break;
          case AI_INT32:
            Export_MetadataInteger
                      (this,pKey,**(int32_t **)((long)&paVar1->mType + lVar7),pTabLevel_00);
            break;
          case AI_UINT64:
            goto switchD_0035cbcf_caseD_2;
          case AI_FLOAT:
            Export_MetadataFloat(this,pKey,**(float **)((long)&paVar1->mType + lVar7),pTabLevel_00);
            break;
          case AI_DOUBLE:
            Export_MetadataDouble
                      (this,pKey,**(double **)((long)&paVar1->mType + lVar7),pTabLevel_00);
            break;
          case AI_AISTRING:
            Export_MetadataString
                      (this,pKey,*(aiString **)((long)&paVar1->mType + lVar7),pTabLevel_00);
          }
        }
        else {
switchD_0035cbcf_caseD_2:
          to_string<aiMetadataType>(&local_198,value);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_200,"Unsupported metadata type: ",&local_198);
          LogError(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_200);
          std::__cxx11::string::~string((string *)local_200);
          std::__cxx11::string::~string((string *)&local_198);
        }
        paVar5 = pNode->mMetaData;
        lVar7 = lVar7 + 0x10;
        lVar8 = lVar8 + 0x404;
      }
    }
    for (uVar6 = 0; uVar6 < pNode->mNumMeshes; uVar6 = uVar6 + 1) {
      Export_Mesh(this,(ulong)pNode->mMeshes[uVar6],pTabLevel_00);
    }
    for (uVar6 = 0; uVar6 < pNode->mNumChildren; uVar6 = uVar6 + 1) {
      Export_Node(this,pNode->mChildren[uVar6],pTabLevel_00);
    }
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"Group",(allocator<char> *)&local_198);
      NodeHelper_CloseNode(this,(string *)local_200,local_1c0);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"Transform",(allocator<char> *)&local_198);
      NodeHelper_CloseNode(this,(string *)local_200,local_1c0);
    }
    std::__cxx11::string::~string((string *)local_200);
  }
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&attr_list.
            super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
          );
  return;
}

Assistant:

void X3DExporter::Export_Node(const aiNode *pNode, const size_t pTabLevel)
{
bool transform = false;
list<SAttribute> attr_list;

	// In Assimp lights is stored in next way: light source store in mScene->mLights and in node tree must present aiNode with name same as
	// light source has. Considering it we must compare every aiNode name with light sources names. Why not to look where ligths is present
	// and save them to fili? Because corresponding aiNode can be already written to file and we can only add information to file not to edit.
	if(CheckAndExport_Light(*pNode, pTabLevel)) return;

	// Check if need DEF.
	if(pNode->mName.length) attr_list.push_back({"DEF", pNode->mName.C_Str()});

	// Check if need <Transformation> node against <Group>.
	if(!pNode->mTransformation.IsIdentity())
	{
		auto Vector2String = [this](const aiVector3D pVector) -> string
		{
			string tstr = to_string(pVector.x) + " " + to_string(pVector.y) + " " + to_string(pVector.z);

			AttrHelper_CommaToPoint(tstr);

			return tstr;
		};

		auto Rotation2String = [this](const aiVector3D pAxis, const ai_real pAngle) -> string
		{
			string tstr = to_string(pAxis.x) + " " + to_string(pAxis.y) + " " + to_string(pAxis.z) + " " + to_string(pAngle);

			AttrHelper_CommaToPoint(tstr);

			return tstr;
		};

		aiVector3D scale, translate, rotate_axis;
		ai_real rotate_angle;

		transform = true;
		pNode->mTransformation.Decompose(scale, rotate_axis, rotate_angle, translate);
		// Check if values different from default
		if((rotate_angle != 0) && (rotate_axis.Length() > 0))
			attr_list.push_back({"rotation", Rotation2String(rotate_axis, rotate_angle)});

        if(!scale.Equal({1.0,1.0,1.0})) {
            attr_list.push_back({"scale", Vector2String(scale)});
        }
        if(translate.Length() > 0) {
            attr_list.push_back({"translation", Vector2String(translate)});
        }
	}

	// Begin node if need.
	if(transform)
		NodeHelper_OpenNode("Transform", pTabLevel, false, attr_list);
	else
		NodeHelper_OpenNode("Group", pTabLevel);

	// Export metadata
	if(pNode->mMetaData != nullptr)
	{
		for(size_t idx_prop = 0; idx_prop < pNode->mMetaData->mNumProperties; idx_prop++)
		{
			const aiString* key;
			const aiMetadataEntry* entry;

			if(pNode->mMetaData->Get(idx_prop, key, entry))
			{
				switch(entry->mType)
				{
					case AI_BOOL:
						Export_MetadataBoolean(*key, *static_cast<bool*>(entry->mData), pTabLevel + 1);
						break;
					case AI_DOUBLE:
						Export_MetadataDouble(*key, *static_cast<double*>(entry->mData), pTabLevel + 1);
						break;
					case AI_FLOAT:
						Export_MetadataFloat(*key, *static_cast<float*>(entry->mData), pTabLevel + 1);
						break;
					case AI_INT32:
						Export_MetadataInteger(*key, *static_cast<int32_t*>(entry->mData), pTabLevel + 1);
						break;
					case AI_AISTRING:
						Export_MetadataString(*key, *static_cast<aiString*>(entry->mData), pTabLevel + 1);
						break;
					default:
						LogError("Unsupported metadata type: " + to_string(entry->mType));
						break;
				}// switch(entry->mType)
			}
		}
	}// if(pNode->mMetaData != nullptr)

	// Export meshes.
	for(size_t idx_mesh = 0; idx_mesh < pNode->mNumMeshes; idx_mesh++) Export_Mesh(pNode->mMeshes[idx_mesh], pTabLevel + 1);
	// Export children.
	for(size_t idx_node = 0; idx_node < pNode->mNumChildren; idx_node++) Export_Node(pNode->mChildren[idx_node], pTabLevel + 1);

	// End node if need.
	if(transform)
		NodeHelper_CloseNode("Transform", pTabLevel);
	else
		NodeHelper_CloseNode("Group", pTabLevel);
}